

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx2::SubGridMBIntersectorKPluecker<4,_8,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  ushort uVar1;
  ushort uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  RTCFilterFunctionN p_Var7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  int iVar27;
  uint uVar28;
  AABBNodeMB4D *node1;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  long lVar32;
  long lVar33;
  undefined4 uVar34;
  ulong unaff_RBX;
  size_t mask;
  Geometry *pGVar35;
  ulong uVar36;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  size_t sVar42;
  ulong uVar43;
  ulong uVar44;
  RayK<8> *pRVar45;
  long lVar46;
  bool bVar47;
  undefined1 auVar49 [16];
  float fVar48;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  float fVar66;
  float fVar67;
  float fVar75;
  float fVar76;
  vint4 ai;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  vint4 bi;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  vint4 ai_1;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  vint4 bi_1;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  vint4 bi_7;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [64];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [64];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [64];
  float fVar133;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [32];
  float fVar141;
  undefined1 auVar137 [32];
  float fVar139;
  float fVar140;
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 auVar138 [64];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  float fVar148;
  float fVar153;
  float fVar154;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar163;
  float fVar164;
  float fVar165;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar168;
  float fVar169;
  float fVar170;
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [64];
  vint4 bi_5;
  vint4 bi_2;
  RTCFilterFunctionNArguments args;
  vint<8> itime;
  vfloat<8> ftime;
  PlueckerHitM<8,_embree::avx2::UVIdentity<8>_> hit;
  NodeRef stack [244];
  undefined1 local_ea9;
  ulong *local_ea8;
  ulong local_ea0;
  ulong local_e98;
  ulong local_e90;
  ulong local_e88;
  ulong local_e80;
  uint local_e78;
  uint local_e74;
  ulong local_e70;
  size_t local_e68;
  float local_e60;
  float fStack_e5c;
  float fStack_e58;
  float fStack_e54;
  float fStack_e50;
  float fStack_e4c;
  float fStack_e48;
  float fStack_e44;
  undefined1 local_e30 [16];
  undefined1 local_e20 [32];
  undefined1 local_e00 [32];
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined1 local_dc0 [32];
  undefined1 local_d90 [16];
  undefined1 local_d80 [16];
  float local_d70;
  float fStack_d6c;
  float fStack_d68;
  float fStack_d64;
  float local_d60;
  float fStack_d5c;
  float fStack_d58;
  float fStack_d54;
  float local_d50;
  float fStack_d4c;
  float fStack_d48;
  float fStack_d44;
  float local_d40;
  float fStack_d3c;
  float fStack_d38;
  float fStack_d34;
  float local_d30;
  float fStack_d2c;
  float fStack_d28;
  float fStack_d24;
  float local_d20;
  float fStack_d1c;
  float fStack_d18;
  float fStack_d14;
  undefined1 local_d10 [16];
  undefined1 local_d00 [16];
  ulong local_cf0;
  long local_ce8;
  ulong local_ce0;
  RayK<8> *local_cd8;
  ulong local_cd0;
  ulong local_cc8;
  long local_cc0;
  long local_cb8;
  Scene *local_cb0;
  ulong *local_ca8;
  Geometry *local_ca0;
  undefined1 auStack_c98 [24];
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  RTCFilterFunctionNArguments local_c50;
  undefined1 local_c20 [32];
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined1 local_be0 [32];
  undefined1 local_bc0 [32];
  undefined1 local_ba0 [8];
  float fStack_b98;
  float fStack_b94;
  float fStack_b90;
  float fStack_b8c;
  float fStack_b88;
  undefined1 local_b80 [32];
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 *local_a20;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  float local_960 [4];
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  undefined4 uStack_944;
  float local_940 [4];
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  undefined4 uStack_924;
  RTCHitN local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined4 local_8c0;
  undefined4 uStack_8bc;
  undefined4 uStack_8b8;
  undefined4 uStack_8b4;
  undefined4 uStack_8b0;
  undefined4 uStack_8ac;
  undefined4 uStack_8a8;
  undefined4 uStack_8a4;
  undefined1 local_8a0 [32];
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  local_ea8 = local_7f8;
  local_800 = root.ptr;
  uVar34 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_d00._4_4_ = uVar34;
  local_d00._0_4_ = uVar34;
  local_d00._8_4_ = uVar34;
  local_d00._12_4_ = uVar34;
  auVar132 = ZEXT1664(local_d00);
  uVar34 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_d10._4_4_ = uVar34;
  local_d10._0_4_ = uVar34;
  local_d10._8_4_ = uVar34;
  local_d10._12_4_ = uVar34;
  auVar138 = ZEXT1664(local_d10);
  uVar34 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_e30._4_4_ = uVar34;
  local_e30._0_4_ = uVar34;
  local_e30._8_4_ = uVar34;
  local_e30._12_4_ = uVar34;
  auVar120 = ZEXT1664(local_e30);
  fVar65 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar80 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar48 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar60 = fVar65 * 0.99999964;
  fVar61 = fVar80 * 0.99999964;
  fVar62 = fVar48 * 0.99999964;
  fVar65 = fVar65 * 1.0000004;
  fVar80 = fVar80 * 1.0000004;
  fVar48 = fVar48 * 1.0000004;
  uVar36 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar39 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar40 = uVar36 ^ 0x10;
  uVar41 = uVar38 ^ 0x10;
  uVar43 = uVar39 ^ 0x10;
  iVar27 = (tray->tnear).field_0.i[k];
  local_d80._4_4_ = iVar27;
  local_d80._0_4_ = iVar27;
  local_d80._8_4_ = iVar27;
  local_d80._12_4_ = iVar27;
  auVar111 = ZEXT1664(local_d80);
  iVar27 = (tray->tfar).field_0.i[k];
  local_d90._4_4_ = iVar27;
  local_d90._0_4_ = iVar27;
  local_d90._8_4_ = iVar27;
  local_d90._12_4_ = iVar27;
  auVar176 = ZEXT1664(local_d90);
  local_b80._16_16_ = mm_lookupmask_ps._240_16_;
  local_b80._0_16_ = mm_lookupmask_ps._0_16_;
  iVar27 = 1 << ((uint)k & 0x1f);
  auVar53._4_4_ = iVar27;
  auVar53._0_4_ = iVar27;
  auVar53._8_4_ = iVar27;
  auVar53._12_4_ = iVar27;
  auVar53._16_4_ = iVar27;
  auVar53._20_4_ = iVar27;
  auVar53._24_4_ = iVar27;
  auVar53._28_4_ = iVar27;
  auVar54 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar53 = vpand_avx2(auVar53,auVar54);
  local_be0 = vpcmpeqd_avx2(auVar53,auVar54);
  auVar71._8_4_ = 0x3f800000;
  auVar71._0_8_ = &DAT_3f8000003f800000;
  auVar71._12_4_ = 0x3f800000;
  auVar71._16_4_ = 0x3f800000;
  auVar71._20_4_ = 0x3f800000;
  auVar71._24_4_ = 0x3f800000;
  auVar71._28_4_ = 0x3f800000;
  auVar54._8_4_ = 0xbf800000;
  auVar54._0_8_ = 0xbf800000bf800000;
  auVar54._12_4_ = 0xbf800000;
  auVar54._16_4_ = 0xbf800000;
  auVar54._20_4_ = 0xbf800000;
  auVar54._24_4_ = 0xbf800000;
  auVar54._28_4_ = 0xbf800000;
  _local_ba0 = vblendvps_avx(auVar71,auVar54,local_b80);
  fVar63 = fVar48;
  fVar64 = fVar48;
  fVar66 = fVar48;
  fVar67 = fVar60;
  fVar75 = fVar60;
  fVar76 = fVar60;
  fVar77 = fVar61;
  fVar78 = fVar61;
  fVar79 = fVar61;
  fVar163 = fVar62;
  fVar164 = fVar62;
  fVar165 = fVar62;
  fVar168 = fVar65;
  fVar169 = fVar65;
  fVar170 = fVar65;
  fVar133 = fVar80;
  fVar139 = fVar80;
  fVar140 = fVar80;
  local_ea0 = uVar41;
  local_e98 = uVar40;
  local_e90 = uVar39;
  local_e88 = uVar38;
  local_e80 = uVar36;
  local_e68 = k;
  local_d70 = fVar48;
  fStack_d6c = fVar48;
  fStack_d68 = fVar48;
  fStack_d64 = fVar48;
  local_d60 = fVar80;
  fStack_d5c = fVar80;
  fStack_d58 = fVar80;
  fStack_d54 = fVar80;
  local_d50 = fVar65;
  fStack_d4c = fVar65;
  fStack_d48 = fVar65;
  fStack_d44 = fVar65;
  local_d40 = fVar62;
  fStack_d3c = fVar62;
  fStack_d38 = fVar62;
  fStack_d34 = fVar62;
  local_d30 = fVar61;
  fStack_d2c = fVar61;
  fStack_d28 = fVar61;
  fStack_d24 = fVar61;
  local_d20 = fVar60;
  fStack_d1c = fVar60;
  fStack_d18 = fVar60;
  fStack_d14 = fVar60;
  local_cd8 = ray;
  do {
    local_ca8 = local_ea8;
    if (local_ea8 == &local_800) break;
    uVar44 = local_ea8[-1];
    local_ea8 = local_ea8 + -1;
    do {
      if ((uVar44 & 8) == 0) {
        uVar29 = uVar44 & 0xfffffffffffffff0;
        uVar34 = *(undefined4 *)(ray + k * 4 + 0xe0);
        auVar49._4_4_ = uVar34;
        auVar49._0_4_ = uVar34;
        auVar49._8_4_ = uVar34;
        auVar49._12_4_ = uVar34;
        auVar50 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar29 + 0x80 + uVar36),auVar49,
                                  *(undefined1 (*) [16])(uVar29 + 0x20 + uVar36));
        auVar50 = vsubps_avx(auVar50,auVar132._0_16_);
        auVar81 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar29 + 0x80 + uVar38),auVar49,
                                  *(undefined1 (*) [16])(uVar29 + 0x20 + uVar38));
        auVar68._0_4_ = fVar60 * auVar50._0_4_;
        auVar68._4_4_ = fVar67 * auVar50._4_4_;
        auVar68._8_4_ = fVar75 * auVar50._8_4_;
        auVar68._12_4_ = fVar76 * auVar50._12_4_;
        auVar50 = vsubps_avx(auVar81,auVar138._0_16_);
        auVar81._0_4_ = fVar61 * auVar50._0_4_;
        auVar81._4_4_ = fVar77 * auVar50._4_4_;
        auVar81._8_4_ = fVar78 * auVar50._8_4_;
        auVar81._12_4_ = fVar79 * auVar50._12_4_;
        auVar50 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar29 + 0x80 + uVar39),auVar49,
                                  *(undefined1 (*) [16])(uVar29 + 0x20 + uVar39));
        auVar50 = vsubps_avx(auVar50,auVar120._0_16_);
        auVar89._0_4_ = fVar62 * auVar50._0_4_;
        auVar89._4_4_ = fVar163 * auVar50._4_4_;
        auVar89._8_4_ = fVar164 * auVar50._8_4_;
        auVar89._12_4_ = fVar165 * auVar50._12_4_;
        auVar50 = vmaxps_avx(auVar81,auVar89);
        auVar81 = vmaxps_avx(auVar111._0_16_,auVar68);
        auVar50 = vmaxps_avx(auVar81,auVar50);
        auVar81 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar29 + 0x80 + uVar40),auVar49,
                                  *(undefined1 (*) [16])(uVar29 + 0x20 + uVar40));
        auVar81 = vsubps_avx(auVar81,auVar132._0_16_);
        auVar82._0_4_ = fVar65 * auVar81._0_4_;
        auVar82._4_4_ = fVar168 * auVar81._4_4_;
        auVar82._8_4_ = fVar169 * auVar81._8_4_;
        auVar82._12_4_ = fVar170 * auVar81._12_4_;
        auVar81 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar29 + 0x80 + uVar41),auVar49,
                                  *(undefined1 (*) [16])(uVar29 + 0x20 + uVar41));
        auVar81 = vsubps_avx(auVar81,auVar138._0_16_);
        auVar90._0_4_ = fVar80 * auVar81._0_4_;
        auVar90._4_4_ = fVar133 * auVar81._4_4_;
        auVar90._8_4_ = fVar139 * auVar81._8_4_;
        auVar90._12_4_ = fVar140 * auVar81._12_4_;
        auVar81 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar29 + 0x80 + uVar43),auVar49,
                                  *(undefined1 (*) [16])(uVar29 + 0x20 + uVar43));
        auVar81 = vsubps_avx(auVar81,auVar120._0_16_);
        auVar97._0_4_ = fVar48 * auVar81._0_4_;
        auVar97._4_4_ = fVar63 * auVar81._4_4_;
        auVar97._8_4_ = fVar64 * auVar81._8_4_;
        auVar97._12_4_ = fVar66 * auVar81._12_4_;
        auVar81 = vminps_avx(auVar90,auVar97);
        auVar68 = vminps_avx(auVar176._0_16_,auVar82);
        auVar81 = vminps_avx(auVar68,auVar81);
        if (((uint)uVar44 & 7) == 6) {
          auVar81 = vcmpps_avx(auVar50,auVar81,2);
          auVar50 = vcmpps_avx(*(undefined1 (*) [16])(uVar29 + 0xe0),auVar49,2);
          auVar68 = vcmpps_avx(auVar49,*(undefined1 (*) [16])(uVar29 + 0xf0),1);
          auVar50 = vandps_avx(auVar50,auVar68);
          auVar50 = vandps_avx(auVar50,auVar81);
        }
        else {
          auVar50 = vcmpps_avx(auVar50,auVar81,2);
        }
        auVar50 = vpslld_avx(auVar50,0x1f);
        uVar34 = vmovmskps_avx(auVar50);
        unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),uVar34);
      }
      if ((uVar44 & 8) == 0) {
        if (unaff_RBX == 0) {
          uVar28 = 4;
        }
        else {
          uVar29 = uVar44 & 0xfffffffffffffff0;
          lVar33 = 0;
          for (uVar44 = unaff_RBX; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000) {
            lVar33 = lVar33 + 1;
          }
          uVar28 = 0;
          for (uVar31 = unaff_RBX - 1 & unaff_RBX; uVar44 = *(ulong *)(uVar29 + lVar33 * 8),
              uVar31 != 0; uVar31 = uVar31 - 1 & uVar31) {
            *local_ea8 = uVar44;
            local_ea8 = local_ea8 + 1;
            lVar33 = 0;
            for (uVar44 = uVar31; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000) {
              lVar33 = lVar33 + 1;
            }
          }
        }
      }
      else {
        uVar28 = 6;
      }
    } while (uVar28 == 0);
    if (uVar28 == 6) {
      local_ce0 = (ulong)((uint)uVar44 & 0xf) - 8;
      bVar47 = local_ce0 != 0;
      if (bVar47) {
        uVar44 = uVar44 & 0xfffffffffffffff0;
        local_cc8 = 0;
        do {
          local_ce8 = local_cc8 * 0x90;
          uVar29 = *(ulong *)(uVar44 + 0x20 + local_ce8);
          auVar51._8_8_ = 0;
          auVar51._0_8_ = uVar29;
          auVar50 = vpmovzxbd_avx(auVar51);
          auVar50 = vcvtdq2ps_avx(auVar50);
          uVar34 = *(undefined4 *)(uVar44 + 0x44 + local_ce8);
          auVar104._4_4_ = uVar34;
          auVar104._0_4_ = uVar34;
          auVar104._8_4_ = uVar34;
          auVar104._12_4_ = uVar34;
          uVar34 = *(undefined4 *)(uVar44 + 0x38 + local_ce8);
          auVar112._4_4_ = uVar34;
          auVar112._0_4_ = uVar34;
          auVar112._8_4_ = uVar34;
          auVar112._12_4_ = uVar34;
          auVar68 = vfmadd213ps_fma(auVar50,auVar104,auVar112);
          auVar50._8_8_ = 0;
          auVar50._0_8_ = *(ulong *)(uVar44 + 0x50 + local_ce8);
          auVar50 = vpmovzxbd_avx(auVar50);
          auVar50 = vcvtdq2ps_avx(auVar50);
          uVar34 = *(undefined4 *)(uVar44 + 0x74 + local_ce8);
          auVar121._4_4_ = uVar34;
          auVar121._0_4_ = uVar34;
          auVar121._8_4_ = uVar34;
          auVar121._12_4_ = uVar34;
          uVar34 = *(undefined4 *)(uVar44 + 0x68 + local_ce8);
          auVar126._4_4_ = uVar34;
          auVar126._0_4_ = uVar34;
          auVar126._8_4_ = uVar34;
          auVar126._12_4_ = uVar34;
          auVar49 = vfmadd213ps_fma(auVar50,auVar121,auVar126);
          auVar69._8_8_ = 0;
          auVar69._0_8_ = *(ulong *)(uVar44 + 0x24 + local_ce8);
          auVar50 = vpmovzxbd_avx(auVar69);
          auVar50 = vcvtdq2ps_avx(auVar50);
          auVar82 = vfmadd213ps_fma(auVar50,auVar104,auVar112);
          auVar105._8_8_ = 0;
          auVar105._0_8_ = *(ulong *)(uVar44 + 0x54 + local_ce8);
          auVar50 = vpmovzxbd_avx(auVar105);
          auVar50 = vcvtdq2ps_avx(auVar50);
          auVar89 = vfmadd213ps_fma(auVar50,auVar121,auVar126);
          auVar113._8_8_ = 0;
          auVar113._0_8_ = *(ulong *)(uVar44 + 0x28 + local_ce8);
          auVar50 = vpmovzxbd_avx(auVar113);
          auVar50 = vcvtdq2ps_avx(auVar50);
          uVar34 = *(undefined4 *)(uVar44 + 0x48 + local_ce8);
          auVar134._4_4_ = uVar34;
          auVar134._0_4_ = uVar34;
          auVar134._8_4_ = uVar34;
          auVar134._12_4_ = uVar34;
          uVar34 = *(undefined4 *)(uVar44 + 0x3c + local_ce8);
          auVar145._4_4_ = uVar34;
          auVar145._0_4_ = uVar34;
          auVar145._8_4_ = uVar34;
          auVar145._12_4_ = uVar34;
          auVar90 = vfmadd213ps_fma(auVar50,auVar134,auVar145);
          auVar122._8_8_ = 0;
          auVar122._0_8_ = *(ulong *)(uVar44 + 0x58 + local_ce8);
          auVar50 = vpmovzxbd_avx(auVar122);
          auVar50 = vcvtdq2ps_avx(auVar50);
          uVar34 = *(undefined4 *)(uVar44 + 0x78 + local_ce8);
          auVar149._4_4_ = uVar34;
          auVar149._0_4_ = uVar34;
          auVar149._8_4_ = uVar34;
          auVar149._12_4_ = uVar34;
          uVar34 = *(undefined4 *)(uVar44 + 0x6c + local_ce8);
          auVar159._4_4_ = uVar34;
          auVar159._0_4_ = uVar34;
          auVar159._8_4_ = uVar34;
          auVar159._12_4_ = uVar34;
          auVar97 = vfmadd213ps_fma(auVar50,auVar149,auVar159);
          auVar127._8_8_ = 0;
          auVar127._0_8_ = *(ulong *)(uVar44 + 0x2c + local_ce8);
          auVar50 = vpmovzxbd_avx(auVar127);
          auVar50 = vcvtdq2ps_avx(auVar50);
          auVar52 = vfmadd213ps_fma(auVar50,auVar134,auVar145);
          auVar135._8_8_ = 0;
          auVar135._0_8_ = *(ulong *)(uVar44 + 0x5c + local_ce8);
          auVar50 = vpmovzxbd_avx(auVar135);
          auVar50 = vcvtdq2ps_avx(auVar50);
          auVar70 = vfmadd213ps_fma(auVar50,auVar149,auVar159);
          auVar146._8_8_ = 0;
          auVar146._0_8_ = *(ulong *)(uVar44 + 0x30 + local_ce8);
          auVar50 = vpmovzxbd_avx(auVar146);
          auVar50 = vcvtdq2ps_avx(auVar50);
          uVar34 = *(undefined4 *)(uVar44 + 0x4c + local_ce8);
          auVar150._4_4_ = uVar34;
          auVar150._0_4_ = uVar34;
          auVar150._8_4_ = uVar34;
          auVar150._12_4_ = uVar34;
          uVar34 = *(undefined4 *)(uVar44 + 0x40 + local_ce8);
          auVar160._4_4_ = uVar34;
          auVar160._0_4_ = uVar34;
          auVar160._8_4_ = uVar34;
          auVar160._12_4_ = uVar34;
          auVar83 = vfmadd213ps_fma(auVar50,auVar150,auVar160);
          auVar166._8_8_ = 0;
          auVar166._0_8_ = *(ulong *)(uVar44 + 0x60 + local_ce8);
          auVar50 = vpmovzxbd_avx(auVar166);
          auVar50 = vcvtdq2ps_avx(auVar50);
          uVar34 = *(undefined4 *)(uVar44 + 0x7c + local_ce8);
          auVar171._4_4_ = uVar34;
          auVar171._0_4_ = uVar34;
          auVar171._8_4_ = uVar34;
          auVar171._12_4_ = uVar34;
          auVar173._8_8_ = 0;
          auVar173._0_8_ = *(ulong *)(uVar44 + 0x34 + local_ce8);
          auVar81 = vpmovzxbd_avx(auVar173);
          auVar81 = vcvtdq2ps_avx(auVar81);
          auVar81 = vfmadd213ps_fma(auVar81,auVar150,auVar160);
          uVar34 = *(undefined4 *)(uVar44 + 0x70 + local_ce8);
          auVar151._4_4_ = uVar34;
          auVar151._0_4_ = uVar34;
          auVar151._8_4_ = uVar34;
          auVar151._12_4_ = uVar34;
          auVar91 = vfmadd213ps_fma(auVar50,auVar171,auVar151);
          auVar161._8_8_ = 0;
          auVar161._0_8_ = *(ulong *)(uVar44 + 100 + local_ce8);
          auVar50 = vpmovzxbd_avx(auVar161);
          auVar50 = vcvtdq2ps_avx(auVar50);
          auVar98 = vfmadd213ps_fma(auVar50,auVar171,auVar151);
          fVar65 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(uVar44 + 0x80 + local_ce8)) *
                   *(float *)(uVar44 + 0x84 + local_ce8);
          auVar152._4_4_ = fVar65;
          auVar152._0_4_ = fVar65;
          auVar152._8_4_ = fVar65;
          auVar152._12_4_ = fVar65;
          auVar50 = vsubps_avx(auVar49,auVar68);
          auVar68 = vfmadd213ps_fma(auVar50,auVar152,auVar68);
          auVar50 = vsubps_avx(auVar89,auVar82);
          auVar49 = vfmadd213ps_fma(auVar50,auVar152,auVar82);
          auVar50 = vsubps_avx(auVar97,auVar90);
          auVar82 = vfmadd213ps_fma(auVar50,auVar152,auVar90);
          auVar50 = vsubps_avx(auVar70,auVar52);
          auVar89 = vfmadd213ps_fma(auVar50,auVar152,auVar52);
          auVar50 = vsubps_avx(auVar91,auVar83);
          auVar90 = vfmadd213ps_fma(auVar50,auVar152,auVar83);
          auVar50 = vsubps_avx(auVar98,auVar81);
          auVar97 = vfmadd213ps_fma(auVar50,auVar152,auVar81);
          auVar50 = vpminub_avx(auVar51,auVar69);
          auVar52._8_8_ = 0;
          auVar52._0_8_ = uVar29;
          auVar50 = vpcmpeqb_avx(auVar52,auVar50);
          auVar81 = vsubps_avx(auVar68,local_d00);
          auVar70._0_4_ = local_d20 * auVar81._0_4_;
          auVar70._4_4_ = fStack_d1c * auVar81._4_4_;
          auVar70._8_4_ = fStack_d18 * auVar81._8_4_;
          auVar70._12_4_ = fStack_d14 * auVar81._12_4_;
          auVar81 = vsubps_avx(auVar82,local_d10);
          auVar91._0_4_ = local_d30 * auVar81._0_4_;
          auVar91._4_4_ = fStack_d2c * auVar81._4_4_;
          auVar91._8_4_ = fStack_d28 * auVar81._8_4_;
          auVar91._12_4_ = fStack_d24 * auVar81._12_4_;
          auVar81 = vsubps_avx(auVar49,local_d00);
          auVar83._0_4_ = local_d50 * auVar81._0_4_;
          auVar83._4_4_ = fStack_d4c * auVar81._4_4_;
          auVar83._8_4_ = fStack_d48 * auVar81._8_4_;
          auVar83._12_4_ = fStack_d44 * auVar81._12_4_;
          auVar81 = vsubps_avx(auVar89,local_d10);
          auVar98._0_4_ = local_d60 * auVar81._0_4_;
          auVar98._4_4_ = fStack_d5c * auVar81._4_4_;
          auVar98._8_4_ = fStack_d58 * auVar81._8_4_;
          auVar98._12_4_ = fStack_d54 * auVar81._12_4_;
          auVar68 = vpminsd_avx(auVar70,auVar83);
          auVar81 = vpmaxsd_avx(auVar70,auVar83);
          auVar49 = vpminsd_avx(auVar91,auVar98);
          auVar68 = vpmaxsd_avx(auVar68,auVar49);
          auVar49 = vpmaxsd_avx(auVar91,auVar98);
          auVar82 = vsubps_avx(auVar90,local_e30);
          auVar99._0_4_ = local_d40 * auVar82._0_4_;
          auVar99._4_4_ = fStack_d3c * auVar82._4_4_;
          auVar99._8_4_ = fStack_d38 * auVar82._8_4_;
          auVar99._12_4_ = fStack_d34 * auVar82._12_4_;
          auVar82 = vsubps_avx(auVar97,local_e30);
          auVar106._0_4_ = local_d70 * auVar82._0_4_;
          auVar106._4_4_ = fStack_d6c * auVar82._4_4_;
          auVar106._8_4_ = fStack_d68 * auVar82._8_4_;
          auVar106._12_4_ = fStack_d64 * auVar82._12_4_;
          auVar82 = vpminsd_avx(auVar81,auVar49);
          auVar49 = vpminsd_avx(auVar99,auVar106);
          auVar81 = vpmaxsd_avx(auVar99,auVar106);
          auVar49 = vpmaxsd_avx(auVar49,local_d80);
          auVar68 = vpmaxsd_avx(auVar68,auVar49);
          auVar81 = vpminsd_avx(auVar81,local_d90);
          auVar81 = vpminsd_avx(auVar82,auVar81);
          auVar81 = vpcmpgtd_avx(auVar68,auVar81);
          auVar50 = vpmovsxbd_avx(auVar50);
          auVar50 = vpandn_avx(auVar81,auVar50);
          uVar28 = vmovmskps_avx(auVar50);
          if (uVar28 != 0) {
            local_ce8 = local_ce8 + uVar44;
            local_cd0 = (ulong)(uVar28 & 0xff);
            sVar42 = k;
            pRVar45 = ray;
            do {
              ray = local_cd8;
              k = local_e68;
              lVar33 = 0;
              for (uVar36 = local_cd0; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000)
              {
                lVar33 = lVar33 + 1;
              }
              uVar1 = *(ushort *)(local_ce8 + lVar33 * 8);
              uVar2 = *(ushort *)(local_ce8 + 2 + lVar33 * 8);
              local_c80._4_4_ = *(uint *)(local_ce8 + 0x88);
              local_e70 = (ulong)local_c80._4_4_;
              local_de0._4_4_ = *(uint *)(local_ce8 + 4 + lVar33 * 8);
              local_cf0 = (ulong)local_de0._4_4_;
              local_cb0 = context->scene;
              pGVar35 = (local_cb0->geometries).items[local_e70].ptr;
              local_cb8 = *(long *)&pGVar35->field_0x58;
              local_cc0 = pGVar35[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                          _M_i * local_cf0;
              fVar65 = (pGVar35->time_range).lower;
              auVar55._4_4_ = fVar65;
              auVar55._0_4_ = fVar65;
              auVar55._8_4_ = fVar65;
              auVar55._12_4_ = fVar65;
              auVar55._16_4_ = fVar65;
              auVar55._20_4_ = fVar65;
              auVar55._24_4_ = fVar65;
              auVar55._28_4_ = fVar65;
              fVar80 = pGVar35->fnumTimeSegments;
              auVar53 = vsubps_avx(*(undefined1 (*) [32])(pRVar45 + 0xe0),auVar55);
              fVar65 = (pGVar35->time_range).upper - fVar65;
              auVar56._4_4_ = fVar65;
              auVar56._0_4_ = fVar65;
              auVar56._8_4_ = fVar65;
              auVar56._12_4_ = fVar65;
              auVar56._16_4_ = fVar65;
              auVar56._20_4_ = fVar65;
              auVar56._24_4_ = fVar65;
              auVar56._28_4_ = fVar65;
              auVar53 = vdivps_avx(auVar53,auVar56);
              auVar10._4_4_ = fVar80 * auVar53._4_4_;
              auVar10._0_4_ = fVar80 * auVar53._0_4_;
              auVar10._8_4_ = fVar80 * auVar53._8_4_;
              auVar10._12_4_ = fVar80 * auVar53._12_4_;
              auVar10._16_4_ = fVar80 * auVar53._16_4_;
              auVar10._20_4_ = fVar80 * auVar53._20_4_;
              auVar10._24_4_ = fVar80 * auVar53._24_4_;
              auVar10._28_4_ = auVar53._28_4_;
              auVar53 = vroundps_avx(auVar10,1);
              fVar80 = fVar80 + -1.0;
              auVar72._4_4_ = fVar80;
              auVar72._0_4_ = fVar80;
              auVar72._8_4_ = fVar80;
              auVar72._12_4_ = fVar80;
              auVar72._16_4_ = fVar80;
              auVar72._20_4_ = fVar80;
              auVar72._24_4_ = fVar80;
              auVar72._28_4_ = fVar80;
              auVar53 = vminps_avx(auVar53,auVar72);
              auVar53 = vmaxps_avx(auVar53,_DAT_02020f00);
              local_aa0 = vsubps_avx(auVar10,auVar53);
              local_ac0 = vcvtps2dq_avx(auVar53);
              local_e74 = uVar1 & 0x7fff;
              local_e78 = uVar2 & 0x7fff;
              uVar28 = *(uint *)(local_cb8 + 4 + local_cc0);
              uVar39 = (ulong)uVar28;
              uVar38 = (ulong)(uVar28 * local_e78 + *(int *)(local_cb8 + local_cc0) + local_e74);
              lVar3 = *(long *)&pGVar35[2].numPrimitives;
              lVar32 = (long)*(int *)(local_ac0 + sVar42 * 4) * 0x38;
              lVar4 = *(long *)(lVar3 + 0x10 + lVar32);
              lVar5 = *(long *)(lVar3 + lVar32);
              auVar50 = *(undefined1 (*) [16])(lVar5 + lVar4 * uVar38);
              lVar6 = *(long *)(lVar3 + 0x48 + lVar32);
              auVar81 = *(undefined1 (*) [16])(lVar5 + (uVar38 + 1) * lVar4);
              lVar33 = uVar38 + uVar39;
              auVar68 = *(undefined1 (*) [16])(lVar5 + lVar33 * lVar4);
              lVar30 = uVar38 + uVar39 + 1;
              auVar82 = *(undefined1 (*) [16])(lVar5 + lVar30 * lVar4);
              lVar37 = uVar38 + (-1 < (short)uVar1) + 1;
              auVar49 = *(undefined1 (*) [16])(lVar5 + lVar37 * lVar4);
              lVar46 = (ulong)(-1 < (short)uVar1) + lVar30;
              auVar89 = *(undefined1 (*) [16])(lVar5 + lVar46 * lVar4);
              uVar36 = 0;
              if (-1 < (short)uVar2) {
                uVar36 = uVar39;
              }
              auVar90 = *(undefined1 (*) [16])(lVar5 + (lVar33 + uVar36) * lVar4);
              auVar97 = *(undefined1 (*) [16])(lVar5 + (lVar30 + uVar36) * lVar4);
              auVar52 = *(undefined1 (*) [16])(lVar5 + lVar4 * (uVar36 + lVar46));
              lVar3 = *(long *)(lVar3 + 0x38 + lVar32);
              uVar34 = *(undefined4 *)(local_aa0 + local_e68 * 4);
              auVar174._4_4_ = uVar34;
              auVar174._0_4_ = uVar34;
              auVar174._8_4_ = uVar34;
              auVar174._12_4_ = uVar34;
              auVar70 = vsubps_avx(*(undefined1 (*) [16])(lVar3 + lVar6 * uVar38),auVar50);
              auVar70 = vfmadd213ps_fma(auVar70,auVar174,auVar50);
              auVar50 = vsubps_avx(*(undefined1 (*) [16])(lVar3 + lVar6 * (uVar38 + 1)),auVar81);
              auVar83 = vfmadd213ps_fma(auVar50,auVar174,auVar81);
              auVar50 = vsubps_avx(*(undefined1 (*) [16])(lVar3 + lVar6 * lVar33),auVar68);
              auVar91 = vfmadd213ps_fma(auVar50,auVar174,auVar68);
              auVar50 = vsubps_avx(*(undefined1 (*) [16])(lVar3 + lVar6 * lVar30),auVar82);
              auVar98 = vfmadd213ps_fma(auVar50,auVar174,auVar82);
              auVar50 = vsubps_avx(*(undefined1 (*) [16])(lVar3 + lVar6 * lVar37),auVar49);
              auVar81 = vfmadd213ps_fma(auVar50,auVar174,auVar49);
              auVar50 = vsubps_avx(*(undefined1 (*) [16])(lVar3 + lVar6 * lVar46),auVar89);
              auVar51 = vfmadd213ps_fma(auVar50,auVar174,auVar89);
              auVar50 = vsubps_avx(*(undefined1 (*) [16])(lVar3 + lVar6 * (lVar33 + uVar36)),auVar90
                                  );
              auVar69 = vfmadd213ps_fma(auVar50,auVar174,auVar90);
              auVar50 = vsubps_avx(*(undefined1 (*) [16])(lVar3 + lVar6 * (lVar30 + uVar36)),auVar97
                                  );
              auVar99 = vfmadd213ps_fma(auVar50,auVar174,auVar97);
              auVar50 = vsubps_avx(*(undefined1 (*) [16])(lVar3 + (uVar36 + lVar46) * lVar6),auVar52
                                  );
              auVar52 = vfmadd213ps_fma(auVar50,auVar174,auVar52);
              auVar68 = vunpcklps_avx(auVar83,auVar51);
              auVar50 = vunpckhps_avx(auVar83,auVar51);
              auVar49 = vunpcklps_avx(auVar81,auVar98);
              auVar81 = vunpckhps_avx(auVar81,auVar98);
              auVar82 = vunpcklps_avx(auVar50,auVar81);
              auVar89 = vunpcklps_avx(auVar68,auVar49);
              auVar50 = vunpckhps_avx(auVar68,auVar49);
              auVar49 = vunpcklps_avx(auVar91,auVar99);
              auVar81 = vunpckhps_avx(auVar91,auVar99);
              auVar90 = vunpcklps_avx(auVar98,auVar69);
              auVar68 = vunpckhps_avx(auVar98,auVar69);
              auVar68 = vunpcklps_avx(auVar81,auVar68);
              auVar97 = vunpcklps_avx(auVar49,auVar90);
              auVar81 = vunpckhps_avx(auVar49,auVar90);
              auVar108._16_16_ = auVar99;
              auVar108._0_16_ = auVar91;
              auVar57._16_16_ = auVar51;
              auVar57._0_16_ = auVar83;
              auVar53 = vunpcklps_avx(auVar57,auVar108);
              auVar123._16_16_ = auVar98;
              auVar123._0_16_ = auVar70;
              auVar73._16_16_ = auVar52;
              auVar73._0_16_ = auVar98;
              auVar54 = vunpcklps_avx(auVar123,auVar73);
              auVar10 = vunpcklps_avx(auVar54,auVar53);
              auVar53 = vunpckhps_avx(auVar54,auVar53);
              auVar54 = vunpckhps_avx(auVar57,auVar108);
              auVar71 = vunpckhps_avx(auVar123,auVar73);
              auVar54 = vunpcklps_avx(auVar71,auVar54);
              auVar109._16_16_ = auVar89;
              auVar109._0_16_ = auVar89;
              auVar167._16_16_ = auVar50;
              auVar167._0_16_ = auVar50;
              auVar114._16_16_ = auVar82;
              auVar114._0_16_ = auVar82;
              auVar175._16_16_ = auVar97;
              auVar175._0_16_ = auVar97;
              auVar92._16_16_ = auVar81;
              auVar92._0_16_ = auVar81;
              local_a20 = &local_ea9;
              uVar34 = *(undefined4 *)(local_cd8 + local_e68 * 4);
              auVar128._4_4_ = uVar34;
              auVar128._0_4_ = uVar34;
              auVar128._8_4_ = uVar34;
              auVar128._12_4_ = uVar34;
              auVar128._16_4_ = uVar34;
              auVar128._20_4_ = uVar34;
              auVar128._24_4_ = uVar34;
              auVar128._28_4_ = uVar34;
              uVar34 = *(undefined4 *)(local_cd8 + local_e68 * 4 + 0x20);
              auVar136._4_4_ = uVar34;
              auVar136._0_4_ = uVar34;
              auVar136._8_4_ = uVar34;
              auVar136._12_4_ = uVar34;
              auVar136._16_4_ = uVar34;
              auVar136._20_4_ = uVar34;
              auVar136._24_4_ = uVar34;
              auVar136._28_4_ = uVar34;
              auVar84._16_16_ = auVar68;
              auVar84._0_16_ = auVar68;
              uVar34 = *(undefined4 *)(local_cd8 + local_e68 * 4 + 0x40);
              auVar147._4_4_ = uVar34;
              auVar147._0_4_ = uVar34;
              auVar147._8_4_ = uVar34;
              auVar147._12_4_ = uVar34;
              auVar147._16_4_ = uVar34;
              auVar147._20_4_ = uVar34;
              auVar147._24_4_ = uVar34;
              auVar147._28_4_ = uVar34;
              auVar10 = vsubps_avx(auVar10,auVar128);
              auVar55 = vsubps_avx(auVar53,auVar136);
              auVar56 = vsubps_avx(auVar54,auVar147);
              auVar53 = vsubps_avx(auVar109,auVar128);
              auVar54 = vsubps_avx(auVar167,auVar136);
              auVar71 = vsubps_avx(auVar114,auVar147);
              auVar72 = vsubps_avx(auVar175,auVar128);
              auVar57 = vsubps_avx(auVar92,auVar136);
              auVar119 = vsubps_avx(auVar84,auVar147);
              local_c20 = vsubps_avx(auVar72,auVar10);
              local_b00 = vsubps_avx(auVar57,auVar55);
              local_ae0 = vsubps_avx(auVar119,auVar56);
              auVar58._0_4_ = auVar72._0_4_ + auVar10._0_4_;
              auVar58._4_4_ = auVar72._4_4_ + auVar10._4_4_;
              auVar58._8_4_ = auVar72._8_4_ + auVar10._8_4_;
              auVar58._12_4_ = auVar72._12_4_ + auVar10._12_4_;
              auVar58._16_4_ = auVar72._16_4_ + auVar10._16_4_;
              auVar58._20_4_ = auVar72._20_4_ + auVar10._20_4_;
              auVar58._24_4_ = auVar72._24_4_ + auVar10._24_4_;
              auVar58._28_4_ = auVar72._28_4_ + auVar10._28_4_;
              auVar85._0_4_ = auVar55._0_4_ + auVar57._0_4_;
              auVar85._4_4_ = auVar55._4_4_ + auVar57._4_4_;
              auVar85._8_4_ = auVar55._8_4_ + auVar57._8_4_;
              auVar85._12_4_ = auVar55._12_4_ + auVar57._12_4_;
              auVar85._16_4_ = auVar55._16_4_ + auVar57._16_4_;
              auVar85._20_4_ = auVar55._20_4_ + auVar57._20_4_;
              auVar85._24_4_ = auVar55._24_4_ + auVar57._24_4_;
              auVar85._28_4_ = auVar55._28_4_ + auVar57._28_4_;
              fVar65 = auVar56._0_4_;
              auVar115._0_4_ = auVar119._0_4_ + fVar65;
              fVar80 = auVar56._4_4_;
              auVar115._4_4_ = auVar119._4_4_ + fVar80;
              fVar48 = auVar56._8_4_;
              auVar115._8_4_ = auVar119._8_4_ + fVar48;
              fVar60 = auVar56._12_4_;
              auVar115._12_4_ = auVar119._12_4_ + fVar60;
              fVar61 = auVar56._16_4_;
              auVar115._16_4_ = auVar119._16_4_ + fVar61;
              fVar62 = auVar56._20_4_;
              auVar115._20_4_ = auVar119._20_4_ + fVar62;
              fVar63 = auVar56._24_4_;
              auVar115._24_4_ = auVar119._24_4_ + fVar63;
              auVar115._28_4_ = auVar119._28_4_ + auVar56._28_4_;
              auVar8._4_4_ = local_ae0._4_4_ * auVar85._4_4_;
              auVar8._0_4_ = local_ae0._0_4_ * auVar85._0_4_;
              auVar8._8_4_ = local_ae0._8_4_ * auVar85._8_4_;
              auVar8._12_4_ = local_ae0._12_4_ * auVar85._12_4_;
              auVar8._16_4_ = local_ae0._16_4_ * auVar85._16_4_;
              auVar8._20_4_ = local_ae0._20_4_ * auVar85._20_4_;
              auVar8._24_4_ = local_ae0._24_4_ * auVar85._24_4_;
              auVar8._28_4_ = auVar50._12_4_;
              auVar81 = vfmsub231ps_fma(auVar8,local_b00,auVar115);
              auVar9._4_4_ = local_c20._4_4_ * auVar115._4_4_;
              auVar9._0_4_ = local_c20._0_4_ * auVar115._0_4_;
              auVar9._8_4_ = local_c20._8_4_ * auVar115._8_4_;
              auVar9._12_4_ = local_c20._12_4_ * auVar115._12_4_;
              auVar9._16_4_ = local_c20._16_4_ * auVar115._16_4_;
              auVar9._20_4_ = local_c20._20_4_ * auVar115._20_4_;
              auVar9._24_4_ = local_c20._24_4_ * auVar115._24_4_;
              auVar9._28_4_ = auVar115._28_4_;
              auVar50 = vfmsub231ps_fma(auVar9,local_ae0,auVar58);
              auVar11._4_4_ = local_b00._4_4_ * auVar58._4_4_;
              auVar11._0_4_ = local_b00._0_4_ * auVar58._0_4_;
              auVar11._8_4_ = local_b00._8_4_ * auVar58._8_4_;
              auVar11._12_4_ = local_b00._12_4_ * auVar58._12_4_;
              auVar11._16_4_ = local_b00._16_4_ * auVar58._16_4_;
              auVar11._20_4_ = local_b00._20_4_ * auVar58._20_4_;
              auVar11._24_4_ = local_b00._24_4_ * auVar58._24_4_;
              auVar11._28_4_ = auVar58._28_4_;
              auVar68 = vfmsub231ps_fma(auVar11,local_c20,auVar85);
              uVar34 = *(undefined4 *)(local_cd8 + local_e68 * 4 + 0xa0);
              local_e00._4_4_ = uVar34;
              local_e00._0_4_ = uVar34;
              local_e00._8_4_ = uVar34;
              local_e00._12_4_ = uVar34;
              local_e00._16_4_ = uVar34;
              local_e00._20_4_ = uVar34;
              local_e00._24_4_ = uVar34;
              local_e00._28_4_ = uVar34;
              fStack_e5c = *(float *)(local_cd8 + local_e68 * 4 + 0xc0);
              auVar12._4_4_ = fStack_e5c * auVar68._4_4_;
              auVar12._0_4_ = fStack_e5c * auVar68._0_4_;
              auVar12._8_4_ = fStack_e5c * auVar68._8_4_;
              auVar12._12_4_ = fStack_e5c * auVar68._12_4_;
              auVar12._16_4_ = fStack_e5c * 0.0;
              auVar12._20_4_ = fStack_e5c * 0.0;
              auVar12._24_4_ = fStack_e5c * 0.0;
              auVar12._28_4_ = auVar97._12_4_;
              auVar50 = vfmadd231ps_fma(auVar12,local_e00,ZEXT1632(auVar50));
              uVar34 = *(undefined4 *)(local_cd8 + local_e68 * 4 + 0x80);
              local_dc0._4_4_ = uVar34;
              local_dc0._0_4_ = uVar34;
              local_dc0._8_4_ = uVar34;
              local_dc0._12_4_ = uVar34;
              local_dc0._16_4_ = uVar34;
              local_dc0._20_4_ = uVar34;
              local_dc0._24_4_ = uVar34;
              local_dc0._28_4_ = uVar34;
              auVar50 = vfmadd231ps_fma(ZEXT1632(auVar50),local_dc0,ZEXT1632(auVar81));
              local_b20 = vsubps_avx(auVar55,auVar54);
              local_b40 = vsubps_avx(auVar56,auVar71);
              auVar172._0_4_ = auVar55._0_4_ + auVar54._0_4_;
              auVar172._4_4_ = auVar55._4_4_ + auVar54._4_4_;
              auVar172._8_4_ = auVar55._8_4_ + auVar54._8_4_;
              auVar172._12_4_ = auVar55._12_4_ + auVar54._12_4_;
              auVar172._16_4_ = auVar55._16_4_ + auVar54._16_4_;
              auVar172._20_4_ = auVar55._20_4_ + auVar54._20_4_;
              auVar172._24_4_ = auVar55._24_4_ + auVar54._24_4_;
              auVar172._28_4_ = auVar55._28_4_ + auVar54._28_4_;
              auVar116._0_4_ = auVar71._0_4_ + fVar65;
              auVar116._4_4_ = auVar71._4_4_ + fVar80;
              auVar116._8_4_ = auVar71._8_4_ + fVar48;
              auVar116._12_4_ = auVar71._12_4_ + fVar60;
              auVar116._16_4_ = auVar71._16_4_ + fVar61;
              auVar116._20_4_ = auVar71._20_4_ + fVar62;
              auVar116._24_4_ = auVar71._24_4_ + fVar63;
              auVar116._28_4_ = auVar71._28_4_ + auVar56._28_4_;
              fVar64 = local_b40._0_4_;
              fVar67 = local_b40._4_4_;
              auVar13._4_4_ = auVar172._4_4_ * fVar67;
              auVar13._0_4_ = auVar172._0_4_ * fVar64;
              fVar76 = local_b40._8_4_;
              auVar13._8_4_ = auVar172._8_4_ * fVar76;
              fVar78 = local_b40._12_4_;
              auVar13._12_4_ = auVar172._12_4_ * fVar78;
              fVar163 = local_b40._16_4_;
              auVar13._16_4_ = auVar172._16_4_ * fVar163;
              fVar165 = local_b40._20_4_;
              auVar13._20_4_ = auVar172._20_4_ * fVar165;
              fVar169 = local_b40._24_4_;
              auVar13._24_4_ = auVar172._24_4_ * fVar169;
              auVar13._28_4_ = local_c20._28_4_;
              auVar68 = vfmsub231ps_fma(auVar13,local_b20,auVar116);
              auVar8 = vsubps_avx(auVar10,auVar53);
              fVar66 = auVar8._0_4_;
              fVar75 = auVar8._4_4_;
              auVar14._4_4_ = auVar116._4_4_ * fVar75;
              auVar14._0_4_ = auVar116._0_4_ * fVar66;
              fVar77 = auVar8._8_4_;
              auVar14._8_4_ = auVar116._8_4_ * fVar77;
              fVar79 = auVar8._12_4_;
              auVar14._12_4_ = auVar116._12_4_ * fVar79;
              fVar164 = auVar8._16_4_;
              auVar14._16_4_ = auVar116._16_4_ * fVar164;
              fVar168 = auVar8._20_4_;
              auVar14._20_4_ = auVar116._20_4_ * fVar168;
              fVar170 = auVar8._24_4_;
              auVar14._24_4_ = auVar116._24_4_ * fVar170;
              auVar14._28_4_ = local_ae0._28_4_;
              auVar117._0_4_ = auVar10._0_4_ + auVar53._0_4_;
              auVar117._4_4_ = auVar10._4_4_ + auVar53._4_4_;
              auVar117._8_4_ = auVar10._8_4_ + auVar53._8_4_;
              auVar117._12_4_ = auVar10._12_4_ + auVar53._12_4_;
              auVar117._16_4_ = auVar10._16_4_ + auVar53._16_4_;
              auVar117._20_4_ = auVar10._20_4_ + auVar53._20_4_;
              auVar117._24_4_ = auVar10._24_4_ + auVar53._24_4_;
              auVar117._28_4_ = auVar10._28_4_ + auVar53._28_4_;
              auVar81 = vfmsub231ps_fma(auVar14,local_b40,auVar117);
              fVar148 = local_b20._0_4_;
              fVar153 = local_b20._4_4_;
              auVar15._4_4_ = fVar153 * auVar117._4_4_;
              auVar15._0_4_ = fVar148 * auVar117._0_4_;
              fVar154 = local_b20._8_4_;
              auVar15._8_4_ = fVar154 * auVar117._8_4_;
              fVar155 = local_b20._12_4_;
              auVar15._12_4_ = fVar155 * auVar117._12_4_;
              fVar156 = local_b20._16_4_;
              auVar15._16_4_ = fVar156 * auVar117._16_4_;
              fVar157 = local_b20._20_4_;
              auVar15._20_4_ = fVar157 * auVar117._20_4_;
              fVar158 = local_b20._24_4_;
              auVar15._24_4_ = fVar158 * auVar117._24_4_;
              auVar15._28_4_ = auVar117._28_4_;
              auVar49 = vfmsub231ps_fma(auVar15,auVar8,auVar172);
              auVar118._0_4_ = fStack_e5c * auVar49._0_4_;
              auVar118._4_4_ = fStack_e5c * auVar49._4_4_;
              auVar118._8_4_ = fStack_e5c * auVar49._8_4_;
              auVar118._12_4_ = fStack_e5c * auVar49._12_4_;
              auVar118._16_4_ = fStack_e5c * 0.0;
              auVar118._20_4_ = fStack_e5c * 0.0;
              auVar118._24_4_ = fStack_e5c * 0.0;
              auVar118._28_4_ = 0;
              auVar81 = vfmadd231ps_fma(auVar118,local_e00,ZEXT1632(auVar81));
              auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),local_dc0,ZEXT1632(auVar68));
              auVar9 = vsubps_avx(auVar53,auVar72);
              auVar101._0_4_ = auVar53._0_4_ + auVar72._0_4_;
              auVar101._4_4_ = auVar53._4_4_ + auVar72._4_4_;
              auVar101._8_4_ = auVar53._8_4_ + auVar72._8_4_;
              auVar101._12_4_ = auVar53._12_4_ + auVar72._12_4_;
              auVar101._16_4_ = auVar53._16_4_ + auVar72._16_4_;
              auVar101._20_4_ = auVar53._20_4_ + auVar72._20_4_;
              auVar101._24_4_ = auVar53._24_4_ + auVar72._24_4_;
              auVar101._28_4_ = auVar53._28_4_ + auVar72._28_4_;
              auVar72 = vsubps_avx(auVar54,auVar57);
              auVar124._0_4_ = auVar54._0_4_ + auVar57._0_4_;
              auVar124._4_4_ = auVar54._4_4_ + auVar57._4_4_;
              auVar124._8_4_ = auVar54._8_4_ + auVar57._8_4_;
              auVar124._12_4_ = auVar54._12_4_ + auVar57._12_4_;
              auVar124._16_4_ = auVar54._16_4_ + auVar57._16_4_;
              auVar124._20_4_ = auVar54._20_4_ + auVar57._20_4_;
              auVar124._24_4_ = auVar54._24_4_ + auVar57._24_4_;
              auVar124._28_4_ = auVar54._28_4_ + auVar57._28_4_;
              auVar57 = vsubps_avx(auVar71,auVar119);
              auVar93._0_4_ = auVar71._0_4_ + auVar119._0_4_;
              auVar93._4_4_ = auVar71._4_4_ + auVar119._4_4_;
              auVar93._8_4_ = auVar71._8_4_ + auVar119._8_4_;
              auVar93._12_4_ = auVar71._12_4_ + auVar119._12_4_;
              auVar93._16_4_ = auVar71._16_4_ + auVar119._16_4_;
              auVar93._20_4_ = auVar71._20_4_ + auVar119._20_4_;
              auVar93._24_4_ = auVar71._24_4_ + auVar119._24_4_;
              auVar93._28_4_ = auVar71._28_4_ + auVar119._28_4_;
              auVar129._0_4_ = auVar124._0_4_ * auVar57._0_4_;
              auVar129._4_4_ = auVar124._4_4_ * auVar57._4_4_;
              auVar129._8_4_ = auVar124._8_4_ * auVar57._8_4_;
              auVar129._12_4_ = auVar124._12_4_ * auVar57._12_4_;
              auVar129._16_4_ = auVar124._16_4_ * auVar57._16_4_;
              auVar129._20_4_ = auVar124._20_4_ * auVar57._20_4_;
              auVar129._24_4_ = auVar124._24_4_ * auVar57._24_4_;
              auVar129._28_4_ = 0;
              auVar49 = vfmsub231ps_fma(auVar129,auVar72,auVar93);
              auVar119._4_4_ = auVar93._4_4_ * auVar9._4_4_;
              auVar119._0_4_ = auVar93._0_4_ * auVar9._0_4_;
              auVar119._8_4_ = auVar93._8_4_ * auVar9._8_4_;
              auVar119._12_4_ = auVar93._12_4_ * auVar9._12_4_;
              auVar119._16_4_ = auVar93._16_4_ * auVar9._16_4_;
              auVar119._20_4_ = auVar93._20_4_ * auVar9._20_4_;
              auVar119._24_4_ = auVar93._24_4_ * auVar9._24_4_;
              auVar119._28_4_ = auVar93._28_4_;
              auVar68 = vfmsub231ps_fma(auVar119,auVar57,auVar101);
              auVar16._4_4_ = auVar101._4_4_ * auVar72._4_4_;
              auVar16._0_4_ = auVar101._0_4_ * auVar72._0_4_;
              auVar16._8_4_ = auVar101._8_4_ * auVar72._8_4_;
              auVar16._12_4_ = auVar101._12_4_ * auVar72._12_4_;
              auVar16._16_4_ = auVar101._16_4_ * auVar72._16_4_;
              auVar16._20_4_ = auVar101._20_4_ * auVar72._20_4_;
              auVar16._24_4_ = auVar101._24_4_ * auVar72._24_4_;
              auVar16._28_4_ = auVar101._28_4_;
              auVar82 = vfmsub231ps_fma(auVar16,auVar9,auVar124);
              local_e60 = fStack_e5c;
              fStack_e58 = fStack_e5c;
              fStack_e54 = fStack_e5c;
              fStack_e50 = fStack_e5c;
              fStack_e4c = fStack_e5c;
              fStack_e48 = fStack_e5c;
              fStack_e44 = fStack_e5c;
              auVar102._0_4_ = fStack_e5c * auVar82._0_4_;
              auVar102._4_4_ = fStack_e5c * auVar82._4_4_;
              auVar102._8_4_ = fStack_e5c * auVar82._8_4_;
              auVar102._12_4_ = fStack_e5c * auVar82._12_4_;
              auVar102._16_4_ = fStack_e5c * 0.0;
              auVar102._20_4_ = fStack_e5c * 0.0;
              auVar102._24_4_ = fStack_e5c * 0.0;
              auVar102._28_4_ = 0;
              auVar68 = vfmadd231ps_fma(auVar102,local_e00,ZEXT1632(auVar68));
              auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),local_dc0,ZEXT1632(auVar49));
              auVar162._0_4_ = auVar68._0_4_ + auVar50._0_4_ + auVar81._0_4_;
              auVar162._4_4_ = auVar68._4_4_ + auVar50._4_4_ + auVar81._4_4_;
              auVar162._8_4_ = auVar68._8_4_ + auVar50._8_4_ + auVar81._8_4_;
              auVar162._12_4_ = auVar68._12_4_ + auVar50._12_4_ + auVar81._12_4_;
              local_a40 = ZEXT1632(auVar162);
              auVar94._8_4_ = 0x7fffffff;
              auVar94._0_8_ = 0x7fffffff7fffffff;
              auVar94._12_4_ = 0x7fffffff;
              auVar94._16_4_ = 0x7fffffff;
              auVar94._20_4_ = 0x7fffffff;
              auVar94._24_4_ = 0x7fffffff;
              auVar94._28_4_ = 0x7fffffff;
              local_b60 = ZEXT1632(auVar50);
              auVar53 = vminps_avx(local_b60,ZEXT1632(auVar81));
              auVar53 = vminps_avx(auVar53,ZEXT1632(auVar68));
              local_bc0 = vandps_avx(local_a40,auVar94);
              fVar133 = local_bc0._0_4_ * 1.1920929e-07;
              fVar139 = local_bc0._4_4_ * 1.1920929e-07;
              auVar17._4_4_ = fVar139;
              auVar17._0_4_ = fVar133;
              fVar140 = local_bc0._8_4_ * 1.1920929e-07;
              auVar17._8_4_ = fVar140;
              fVar141 = local_bc0._12_4_ * 1.1920929e-07;
              auVar17._12_4_ = fVar141;
              fVar142 = local_bc0._16_4_ * 1.1920929e-07;
              auVar17._16_4_ = fVar142;
              fVar143 = local_bc0._20_4_ * 1.1920929e-07;
              auVar17._20_4_ = fVar143;
              fVar144 = local_bc0._24_4_ * 1.1920929e-07;
              auVar17._24_4_ = fVar144;
              auVar17._28_4_ = 0x34000000;
              auVar130._0_8_ = CONCAT44(fVar139,fVar133) ^ 0x8000000080000000;
              auVar130._8_4_ = -fVar140;
              auVar130._12_4_ = -fVar141;
              auVar130._16_4_ = -fVar142;
              auVar130._20_4_ = -fVar143;
              auVar130._24_4_ = -fVar144;
              auVar130._28_4_ = 0xb4000000;
              auVar53 = vcmpps_avx(auVar53,auVar130,5);
              auVar119 = ZEXT1632(auVar81);
              auVar71 = vmaxps_avx(local_b60,auVar119);
              auVar54 = vmaxps_avx(auVar71,ZEXT1632(auVar68));
              auVar54 = vcmpps_avx(auVar54,auVar17,2);
              auVar54 = vorps_avx(auVar53,auVar54);
              uVar36 = local_e80;
              uVar38 = local_e88;
              uVar39 = local_e90;
              uVar40 = local_e98;
              uVar41 = local_ea0;
              if ((((((((auVar54 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar54 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar54 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar54 >> 0x7f,0) != '\0') ||
                    (auVar54 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar54 >> 0xbf,0) != '\0') ||
                  (auVar54 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar54[0x1f] < '\0') {
                auVar18._4_4_ = local_ae0._4_4_ * fVar153;
                auVar18._0_4_ = local_ae0._0_4_ * fVar148;
                auVar18._8_4_ = local_ae0._8_4_ * fVar154;
                auVar18._12_4_ = local_ae0._12_4_ * fVar155;
                auVar18._16_4_ = local_ae0._16_4_ * fVar156;
                auVar18._20_4_ = local_ae0._20_4_ * fVar157;
                auVar18._24_4_ = local_ae0._24_4_ * fVar158;
                auVar18._28_4_ = auVar53._28_4_;
                auVar19._4_4_ = fVar75 * local_b00._4_4_;
                auVar19._0_4_ = fVar66 * local_b00._0_4_;
                auVar19._8_4_ = fVar77 * local_b00._8_4_;
                auVar19._12_4_ = fVar79 * local_b00._12_4_;
                auVar19._16_4_ = fVar164 * local_b00._16_4_;
                auVar19._20_4_ = fVar168 * local_b00._20_4_;
                auVar19._24_4_ = fVar170 * local_b00._24_4_;
                auVar19._28_4_ = auVar71._28_4_;
                auVar50 = vfmsub213ps_fma(local_b00,local_b40,auVar18);
                auVar20._4_4_ = fVar67 * auVar72._4_4_;
                auVar20._0_4_ = fVar64 * auVar72._0_4_;
                auVar20._8_4_ = fVar76 * auVar72._8_4_;
                auVar20._12_4_ = fVar78 * auVar72._12_4_;
                auVar20._16_4_ = fVar163 * auVar72._16_4_;
                auVar20._20_4_ = fVar165 * auVar72._20_4_;
                auVar20._24_4_ = fVar169 * auVar72._24_4_;
                auVar20._28_4_ = 0x34000000;
                auVar21._4_4_ = fVar75 * auVar57._4_4_;
                auVar21._0_4_ = fVar66 * auVar57._0_4_;
                auVar21._8_4_ = fVar77 * auVar57._8_4_;
                auVar21._12_4_ = fVar79 * auVar57._12_4_;
                auVar21._16_4_ = fVar164 * auVar57._16_4_;
                auVar21._20_4_ = fVar168 * auVar57._20_4_;
                auVar21._24_4_ = fVar170 * auVar57._24_4_;
                auVar21._28_4_ = 0;
                auVar68 = vfmsub213ps_fma(auVar57,local_b20,auVar20);
                auVar53 = vandps_avx(auVar18,auVar94);
                auVar71 = vandps_avx(auVar20,auVar94);
                auVar53 = vcmpps_avx(auVar53,auVar71,1);
                auVar57 = vblendvps_avx(ZEXT1632(auVar68),ZEXT1632(auVar50),auVar53);
                auVar110._0_4_ = auVar9._0_4_ * fVar148;
                auVar110._4_4_ = auVar9._4_4_ * fVar153;
                auVar110._8_4_ = auVar9._8_4_ * fVar154;
                auVar110._12_4_ = auVar9._12_4_ * fVar155;
                auVar110._16_4_ = auVar9._16_4_ * fVar156;
                auVar110._20_4_ = auVar9._20_4_ * fVar157;
                auVar110._24_4_ = auVar9._24_4_ * fVar158;
                auVar110._28_4_ = 0;
                auVar50 = vfmsub213ps_fma(auVar9,local_b40,auVar21);
                auVar22._4_4_ = local_c20._4_4_ * fVar67;
                auVar22._0_4_ = local_c20._0_4_ * fVar64;
                auVar22._8_4_ = local_c20._8_4_ * fVar76;
                auVar22._12_4_ = local_c20._12_4_ * fVar78;
                auVar22._16_4_ = local_c20._16_4_ * fVar163;
                auVar22._20_4_ = local_c20._20_4_ * fVar165;
                auVar22._24_4_ = local_c20._24_4_ * fVar169;
                auVar22._28_4_ = auVar53._28_4_;
                auVar68 = vfmsub213ps_fma(local_ae0,auVar8,auVar22);
                auVar53 = vandps_avx(auVar22,auVar94);
                auVar71 = vandps_avx(auVar21,auVar94);
                auVar53 = vcmpps_avx(auVar53,auVar71,1);
                auVar9 = vblendvps_avx(ZEXT1632(auVar50),ZEXT1632(auVar68),auVar53);
                auVar50 = vfmsub213ps_fma(local_c20,local_b20,auVar19);
                auVar68 = vfmsub213ps_fma(auVar72,auVar8,auVar110);
                auVar53 = vandps_avx(auVar19,auVar94);
                auVar71 = vandps_avx(auVar110,auVar94);
                auVar53 = vcmpps_avx(auVar53,auVar71,1);
                auVar53 = vblendvps_avx(ZEXT1632(auVar68),ZEXT1632(auVar50),auVar53);
                auVar50 = vpackssdw_avx(auVar54._0_16_,auVar54._16_16_);
                fVar64 = auVar53._0_4_;
                auVar95._0_4_ = fVar64 * fStack_e5c;
                fVar66 = auVar53._4_4_;
                auVar95._4_4_ = fVar66 * fStack_e5c;
                fVar67 = auVar53._8_4_;
                auVar95._8_4_ = fVar67 * fStack_e5c;
                fVar75 = auVar53._12_4_;
                auVar95._12_4_ = fVar75 * fStack_e5c;
                fVar76 = auVar53._16_4_;
                auVar95._16_4_ = fVar76 * fStack_e5c;
                fVar77 = auVar53._20_4_;
                auVar95._20_4_ = fVar77 * fStack_e5c;
                fVar78 = auVar53._24_4_;
                auVar95._24_4_ = fVar78 * fStack_e5c;
                auVar95._28_4_ = 0;
                auVar68 = vfmadd213ps_fma(local_e00,auVar9,auVar95);
                auVar68 = vfmadd213ps_fma(local_dc0,auVar57,ZEXT1632(auVar68));
                auVar71 = ZEXT1632(CONCAT412(auVar68._12_4_ + auVar68._12_4_,
                                             CONCAT48(auVar68._8_4_ + auVar68._8_4_,
                                                      CONCAT44(auVar68._4_4_ + auVar68._4_4_,
                                                               auVar68._0_4_ + auVar68._0_4_))));
                auVar103._0_4_ = fVar64 * fVar65;
                auVar103._4_4_ = fVar66 * fVar80;
                auVar103._8_4_ = fVar67 * fVar48;
                auVar103._12_4_ = fVar75 * fVar60;
                auVar103._16_4_ = fVar76 * fVar61;
                auVar103._20_4_ = fVar77 * fVar62;
                auVar103._24_4_ = fVar78 * fVar63;
                auVar103._28_4_ = 0;
                auVar68 = vfmadd213ps_fma(auVar55,auVar9,auVar103);
                auVar49 = vfmadd213ps_fma(auVar10,auVar57,ZEXT1632(auVar68));
                auVar53 = vrcpps_avx(auVar71);
                auVar137._8_4_ = 0x3f800000;
                auVar137._0_8_ = &DAT_3f8000003f800000;
                auVar137._12_4_ = 0x3f800000;
                auVar137._16_4_ = 0x3f800000;
                auVar137._20_4_ = 0x3f800000;
                auVar137._24_4_ = 0x3f800000;
                auVar137._28_4_ = 0x3f800000;
                auVar68 = vfnmadd213ps_fma(auVar53,auVar71,auVar137);
                auVar68 = vfmadd132ps_fma(ZEXT1632(auVar68),auVar53,auVar53);
                local_9a0 = ZEXT1632(CONCAT412(auVar68._12_4_ * (auVar49._12_4_ + auVar49._12_4_),
                                               CONCAT48(auVar68._8_4_ *
                                                        (auVar49._8_4_ + auVar49._8_4_),
                                                        CONCAT44(auVar68._4_4_ *
                                                                 (auVar49._4_4_ + auVar49._4_4_),
                                                                 auVar68._0_4_ *
                                                                 (auVar49._0_4_ + auVar49._0_4_)))))
                ;
                uVar34 = *(undefined4 *)(local_cd8 + local_e68 * 4 + 0x60);
                auVar125._4_4_ = uVar34;
                auVar125._0_4_ = uVar34;
                auVar125._8_4_ = uVar34;
                auVar125._12_4_ = uVar34;
                auVar125._16_4_ = uVar34;
                auVar125._20_4_ = uVar34;
                auVar125._24_4_ = uVar34;
                auVar125._28_4_ = uVar34;
                uVar34 = *(undefined4 *)(local_cd8 + local_e68 * 4 + 0x100);
                auVar131._4_4_ = uVar34;
                auVar131._0_4_ = uVar34;
                auVar131._8_4_ = uVar34;
                auVar131._12_4_ = uVar34;
                auVar131._16_4_ = uVar34;
                auVar131._20_4_ = uVar34;
                auVar131._24_4_ = uVar34;
                auVar131._28_4_ = uVar34;
                auVar53 = vcmpps_avx(auVar125,local_9a0,2);
                auVar54 = vcmpps_avx(local_9a0,auVar131,2);
                auVar53 = vandps_avx(auVar54,auVar53);
                auVar68 = vpackssdw_avx(auVar53._0_16_,auVar53._16_16_);
                auVar50 = vpand_avx(auVar68,auVar50);
                auVar53 = vpmovsxwd_avx2(auVar50);
                if ((((((((auVar53 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar53 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar53 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar53 >> 0x7f,0) != '\0') ||
                      (auVar53 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar53 >> 0xbf,0) != '\0') ||
                    (auVar53 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar53[0x1f] < '\0') {
                  auVar53 = vcmpps_avx(auVar71,_DAT_02020f00,4);
                  auVar68 = vpackssdw_avx(auVar53._0_16_,auVar53._16_16_);
                  auVar50 = vpand_avx(auVar50,auVar68);
                  local_a00 = vpmovsxwd_avx2(auVar50);
                  if ((((((((local_a00 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (local_a00 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (local_a00 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(local_a00 >> 0x7f,0) != '\0') ||
                        (local_a00 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(local_a00 >> 0xbf,0) != '\0') ||
                      (local_a00 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      local_a00[0x1f] < '\0') {
                    local_a20 = &local_ea9;
                    auVar53 = vsubps_avx(local_a40,auVar119);
                    auVar53 = vblendvps_avx(local_b60,auVar53,local_b80);
                    auVar54 = vsubps_avx(local_a40,local_b60);
                    auVar54 = vblendvps_avx(auVar119,auVar54,local_b80);
                    local_980._4_4_ = auVar57._4_4_ * (float)local_ba0._4_4_;
                    local_980._0_4_ = auVar57._0_4_ * (float)local_ba0._0_4_;
                    local_980._8_4_ = auVar57._8_4_ * fStack_b98;
                    local_980._12_4_ = auVar57._12_4_ * fStack_b94;
                    local_980._16_4_ = auVar57._16_4_ * fStack_b90;
                    local_980._20_4_ = auVar57._20_4_ * fStack_b8c;
                    local_980._24_4_ = auVar57._24_4_ * fStack_b88;
                    local_980._28_4_ = 0;
                    local_960[0] = (float)local_ba0._0_4_ * auVar9._0_4_;
                    local_960[1] = (float)local_ba0._4_4_ * auVar9._4_4_;
                    local_960[2] = fStack_b98 * auVar9._8_4_;
                    local_960[3] = fStack_b94 * auVar9._12_4_;
                    fStack_950 = fStack_b90 * auVar9._16_4_;
                    fStack_94c = fStack_b8c * auVar9._20_4_;
                    fStack_948 = fStack_b88 * auVar9._24_4_;
                    uStack_944 = auVar9._28_4_;
                    local_940[0] = (float)local_ba0._0_4_ * fVar64;
                    local_940[1] = (float)local_ba0._4_4_ * fVar66;
                    local_940[2] = fStack_b98 * fVar67;
                    local_940[3] = fStack_b94 * fVar75;
                    fStack_930 = fStack_b90 * fVar76;
                    fStack_92c = fStack_b8c * fVar77;
                    fStack_928 = fStack_b88 * fVar78;
                    uStack_924 = auVar9._28_4_;
                    auVar59._0_8_ = (ulong)CONCAT24(uVar1,(uint)uVar1) & 0x7fff00007fff;
                    auVar59._8_4_ = local_e74;
                    auVar59._12_4_ = local_e74;
                    auVar59._16_4_ = local_e74;
                    auVar59._20_4_ = local_e74;
                    auVar59._24_4_ = local_e74;
                    auVar59._28_4_ = local_e74;
                    auVar71 = vpaddd_avx2(auVar59,_DAT_0205d4c0);
                    auVar74._0_8_ = (ulong)CONCAT24(uVar2,(uint)uVar2) & 0x7fff00007fff;
                    auVar74._8_4_ = local_e78;
                    auVar74._12_4_ = local_e78;
                    auVar74._16_4_ = local_e78;
                    auVar74._20_4_ = local_e78;
                    auVar74._24_4_ = local_e78;
                    auVar74._28_4_ = local_e78;
                    auVar10 = vpaddd_avx2(auVar74,_DAT_0205d4e0);
                    auVar100._0_4_ = (float)(int)(*(ushort *)(local_cb8 + 8 + local_cc0) - 1);
                    auVar100._4_12_ = auVar81._4_12_;
                    auVar50 = vrcpss_avx(auVar100,auVar100);
                    auVar68 = vfnmadd213ss_fma(auVar100,auVar50,SUB6416(ZEXT464(0x40000000),0));
                    fVar65 = auVar50._0_4_ * auVar68._0_4_;
                    auVar107._0_4_ = (float)(int)(*(ushort *)(local_cb8 + 10 + local_cc0) - 1);
                    auVar107._4_12_ = auVar81._4_12_;
                    auVar50 = vrcpss_avx(auVar107,auVar107);
                    auVar81 = vfnmadd213ss_fma(auVar107,auVar50,SUB6416(ZEXT464(0x40000000),0));
                    fVar80 = auVar50._0_4_ * auVar81._0_4_;
                    auVar71 = vcvtdq2ps_avx(auVar71);
                    fVar66 = auVar71._28_4_ + auVar53._28_4_;
                    fVar48 = (auVar162._0_4_ * auVar71._0_4_ + auVar53._0_4_) * fVar65;
                    fVar60 = (auVar162._4_4_ * auVar71._4_4_ + auVar53._4_4_) * fVar65;
                    local_a80._4_4_ = fVar60;
                    local_a80._0_4_ = fVar48;
                    fVar61 = (auVar162._8_4_ * auVar71._8_4_ + auVar53._8_4_) * fVar65;
                    local_a80._8_4_ = fVar61;
                    fVar62 = (auVar162._12_4_ * auVar71._12_4_ + auVar53._12_4_) * fVar65;
                    local_a80._12_4_ = fVar62;
                    fVar63 = (auVar71._16_4_ * 0.0 + auVar53._16_4_) * fVar65;
                    local_a80._16_4_ = fVar63;
                    fVar64 = (auVar71._20_4_ * 0.0 + auVar53._20_4_) * fVar65;
                    local_a80._20_4_ = fVar64;
                    fVar65 = (auVar71._24_4_ * 0.0 + auVar53._24_4_) * fVar65;
                    local_a80._24_4_ = fVar65;
                    local_a80._28_4_ = fVar66;
                    auVar53 = vcvtdq2ps_avx(auVar10);
                    fVar67 = (auVar162._0_4_ * auVar53._0_4_ + auVar54._0_4_) * fVar80;
                    fVar75 = (auVar162._4_4_ * auVar53._4_4_ + auVar54._4_4_) * fVar80;
                    local_a60._4_4_ = fVar75;
                    local_a60._0_4_ = fVar67;
                    fVar76 = (auVar162._8_4_ * auVar53._8_4_ + auVar54._8_4_) * fVar80;
                    local_a60._8_4_ = fVar76;
                    fVar77 = (auVar162._12_4_ * auVar53._12_4_ + auVar54._12_4_) * fVar80;
                    local_a60._12_4_ = fVar77;
                    fVar78 = (auVar53._16_4_ * 0.0 + auVar54._16_4_) * fVar80;
                    local_a60._16_4_ = fVar78;
                    fVar79 = (auVar53._20_4_ * 0.0 + auVar54._20_4_) * fVar80;
                    local_a60._20_4_ = fVar79;
                    fVar80 = (auVar53._24_4_ * 0.0 + auVar54._24_4_) * fVar80;
                    local_a60._24_4_ = fVar80;
                    local_a60._28_4_ = auVar53._28_4_ + auVar54._28_4_;
                    pGVar35 = (local_cb0->geometries).items[local_e70].ptr;
                    if ((pGVar35->mask & *(uint *)(local_cd8 + local_e68 * 4 + 0x120)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar35->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_00619ad3:
                        auVar132 = ZEXT1664(local_d00);
                        auVar138 = ZEXT1664(local_d10);
                        auVar120 = ZEXT1664(local_e30);
                        auVar111 = ZEXT1664(local_d80);
                        auVar176 = ZEXT1664(local_d90);
                        fVar48 = local_d70;
                        fVar63 = fStack_d6c;
                        fVar64 = fStack_d68;
                        fVar66 = fStack_d64;
                        fVar60 = local_d20;
                        fVar67 = fStack_d1c;
                        fVar75 = fStack_d18;
                        fVar76 = fStack_d14;
                        fVar61 = local_d30;
                        fVar77 = fStack_d2c;
                        fVar78 = fStack_d28;
                        fVar79 = fStack_d24;
                        fVar62 = local_d40;
                        fVar163 = fStack_d3c;
                        fVar164 = fStack_d38;
                        fVar165 = fStack_d34;
                        fVar65 = local_d50;
                        fVar168 = fStack_d4c;
                        fVar169 = fStack_d48;
                        fVar170 = fStack_d44;
                        fVar80 = local_d60;
                        fVar133 = fStack_d5c;
                        fVar139 = fStack_d58;
                        fVar140 = fStack_d54;
                        goto LAB_00619b36;
                      }
                      auVar53 = vrcpps_avx(local_a40);
                      auVar96._8_4_ = 0x3f800000;
                      auVar96._0_8_ = &DAT_3f8000003f800000;
                      auVar96._12_4_ = 0x3f800000;
                      auVar96._16_4_ = 0x3f800000;
                      auVar96._20_4_ = 0x3f800000;
                      auVar96._24_4_ = 0x3f800000;
                      auVar96._28_4_ = 0x3f800000;
                      auVar50 = vfnmadd213ps_fma(local_a40,auVar53,auVar96);
                      auVar50 = vfmadd132ps_fma(ZEXT1632(auVar50),auVar53,auVar53);
                      auVar86._8_4_ = 0x219392ef;
                      auVar86._0_8_ = 0x219392ef219392ef;
                      auVar86._12_4_ = 0x219392ef;
                      auVar86._16_4_ = 0x219392ef;
                      auVar86._20_4_ = 0x219392ef;
                      auVar86._24_4_ = 0x219392ef;
                      auVar86._28_4_ = 0x219392ef;
                      auVar53 = vcmpps_avx(local_bc0,auVar86,5);
                      auVar53 = vandps_avx(ZEXT1632(auVar50),auVar53);
                      auVar23._4_4_ = fVar60 * auVar53._4_4_;
                      auVar23._0_4_ = fVar48 * auVar53._0_4_;
                      auVar23._8_4_ = fVar61 * auVar53._8_4_;
                      auVar23._12_4_ = fVar62 * auVar53._12_4_;
                      auVar23._16_4_ = fVar63 * auVar53._16_4_;
                      auVar23._20_4_ = fVar64 * auVar53._20_4_;
                      auVar23._24_4_ = fVar65 * auVar53._24_4_;
                      auVar23._28_4_ = fVar66;
                      local_9e0 = vminps_avx(auVar23,auVar96);
                      auVar24._4_4_ = fVar75 * auVar53._4_4_;
                      auVar24._0_4_ = fVar67 * auVar53._0_4_;
                      auVar24._8_4_ = fVar76 * auVar53._8_4_;
                      auVar24._12_4_ = fVar77 * auVar53._12_4_;
                      auVar24._16_4_ = fVar78 * auVar53._16_4_;
                      auVar24._20_4_ = fVar79 * auVar53._20_4_;
                      auVar24._24_4_ = fVar80 * auVar53._24_4_;
                      auVar24._28_4_ = local_9e0._28_4_;
                      local_9c0 = vminps_avx(auVar24,auVar96);
                      uVar28 = vmovmskps_avx(local_a00);
                      local_e20 = ZEXT1632(CONCAT151(auVar162._1_15_,uVar28 == 0));
                      if (uVar28 != 0) {
                        lVar33 = 0;
                        uVar31 = (ulong)(uVar28 & 0xff);
                        for (uVar29 = uVar31; (uVar29 & 1) == 0;
                            uVar29 = uVar29 >> 1 | 0x8000000000000000) {
                          lVar33 = lVar33 + 1;
                        }
                        local_c80._0_4_ = local_c80._4_4_;
                        uStack_c78._0_4_ = local_c80._4_4_;
                        uStack_c78._4_4_ = local_c80._4_4_;
                        uStack_c70._0_4_ = local_c80._4_4_;
                        uStack_c70._4_4_ = local_c80._4_4_;
                        uStack_c68._0_4_ = local_c80._4_4_;
                        uStack_c68._4_4_ = local_c80._4_4_;
                        local_de0._0_4_ = local_de0._4_4_;
                        uStack_dd8._0_4_ = local_de0._4_4_;
                        uStack_dd8._4_4_ = local_de0._4_4_;
                        uStack_dd0._0_4_ = local_de0._4_4_;
                        uStack_dd0._4_4_ = local_de0._4_4_;
                        uStack_dc8._0_4_ = local_de0._4_4_;
                        uStack_dc8._4_4_ = local_de0._4_4_;
                        auStack_c98 = auVar56._8_24_;
                        local_ca0 = pGVar35;
                        do {
                          local_dc0._0_8_ = uVar31;
                          fVar48 = *(float *)(ray + k * 4 + 0x100);
                          local_8c0 = *(undefined4 *)(local_9e0 + lVar33 * 4);
                          uVar34 = *(undefined4 *)(local_9c0 + lVar33 * 4);
                          local_8a0._4_4_ = uVar34;
                          local_8a0._0_4_ = uVar34;
                          local_8a0._8_4_ = uVar34;
                          local_8a0._12_4_ = uVar34;
                          local_8a0._16_4_ = uVar34;
                          local_8a0._20_4_ = uVar34;
                          local_8a0._24_4_ = uVar34;
                          local_8a0._28_4_ = uVar34;
                          *(undefined4 *)(ray + k * 4 + 0x100) =
                               *(undefined4 *)(local_9a0 + lVar33 * 4);
                          fVar65 = local_960[lVar33 + -8];
                          auVar87._4_4_ = fVar65;
                          auVar87._0_4_ = fVar65;
                          auVar87._8_4_ = fVar65;
                          auVar87._12_4_ = fVar65;
                          auVar87._16_4_ = fVar65;
                          auVar87._20_4_ = fVar65;
                          auVar87._24_4_ = fVar65;
                          auVar87._28_4_ = fVar65;
                          fVar80 = local_960[lVar33];
                          local_900._4_4_ = fVar80;
                          local_900._0_4_ = fVar80;
                          local_900._8_4_ = fVar80;
                          local_900._12_4_ = fVar80;
                          local_900._16_4_ = fVar80;
                          local_900._20_4_ = fVar80;
                          local_900._24_4_ = fVar80;
                          local_900._28_4_ = fVar80;
                          local_e00._0_8_ = lVar33;
                          fVar80 = local_940[lVar33];
                          local_8e0._4_4_ = fVar80;
                          local_8e0._0_4_ = fVar80;
                          local_8e0._8_4_ = fVar80;
                          local_8e0._12_4_ = fVar80;
                          local_8e0._16_4_ = fVar80;
                          local_8e0._20_4_ = fVar80;
                          local_8e0._24_4_ = fVar80;
                          local_8e0._28_4_ = fVar80;
                          local_c50.context = context->user;
                          local_920[0] = (RTCHitN)SUB41(fVar65,0);
                          local_920[1] = (RTCHitN)(char)((uint)fVar65 >> 8);
                          local_920[2] = (RTCHitN)(char)((uint)fVar65 >> 0x10);
                          local_920[3] = (RTCHitN)(char)((uint)fVar65 >> 0x18);
                          local_920[4] = (RTCHitN)SUB41(fVar65,0);
                          local_920[5] = (RTCHitN)(char)((uint)fVar65 >> 8);
                          local_920[6] = (RTCHitN)(char)((uint)fVar65 >> 0x10);
                          local_920[7] = (RTCHitN)(char)((uint)fVar65 >> 0x18);
                          local_920[8] = (RTCHitN)SUB41(fVar65,0);
                          local_920[9] = (RTCHitN)(char)((uint)fVar65 >> 8);
                          local_920[10] = (RTCHitN)(char)((uint)fVar65 >> 0x10);
                          local_920[0xb] = (RTCHitN)(char)((uint)fVar65 >> 0x18);
                          local_920[0xc] = (RTCHitN)SUB41(fVar65,0);
                          local_920[0xd] = (RTCHitN)(char)((uint)fVar65 >> 8);
                          local_920[0xe] = (RTCHitN)(char)((uint)fVar65 >> 0x10);
                          local_920[0xf] = (RTCHitN)(char)((uint)fVar65 >> 0x18);
                          local_920[0x10] = (RTCHitN)SUB41(fVar65,0);
                          local_920[0x11] = (RTCHitN)(char)((uint)fVar65 >> 8);
                          local_920[0x12] = (RTCHitN)(char)((uint)fVar65 >> 0x10);
                          local_920[0x13] = (RTCHitN)(char)((uint)fVar65 >> 0x18);
                          local_920[0x14] = (RTCHitN)SUB41(fVar65,0);
                          local_920[0x15] = (RTCHitN)(char)((uint)fVar65 >> 8);
                          local_920[0x16] = (RTCHitN)(char)((uint)fVar65 >> 0x10);
                          local_920[0x17] = (RTCHitN)(char)((uint)fVar65 >> 0x18);
                          local_920[0x18] = (RTCHitN)SUB41(fVar65,0);
                          local_920[0x19] = (RTCHitN)(char)((uint)fVar65 >> 8);
                          local_920[0x1a] = (RTCHitN)(char)((uint)fVar65 >> 0x10);
                          local_920[0x1b] = (RTCHitN)(char)((uint)fVar65 >> 0x18);
                          local_920[0x1c] = (RTCHitN)SUB41(fVar65,0);
                          local_920[0x1d] = (RTCHitN)(char)((uint)fVar65 >> 8);
                          local_920[0x1e] = (RTCHitN)(char)((uint)fVar65 >> 0x10);
                          local_920[0x1f] = (RTCHitN)(char)((uint)fVar65 >> 0x18);
                          uStack_8bc = local_8c0;
                          uStack_8b8 = local_8c0;
                          uStack_8b4 = local_8c0;
                          uStack_8b0 = local_8c0;
                          uStack_8ac = local_8c0;
                          uStack_8a8 = local_8c0;
                          uStack_8a4 = local_8c0;
                          local_880 = local_de0;
                          uStack_878 = uStack_dd8;
                          uStack_870 = uStack_dd0;
                          uStack_868 = uStack_dc8;
                          local_860 = local_c80;
                          uStack_858 = uStack_c78;
                          uStack_850 = uStack_c70;
                          uStack_848 = uStack_c68;
                          auVar53 = vpcmpeqd_avx2(auVar87,auVar87);
                          uStack_83c = (local_c50.context)->instID[0];
                          local_840 = uStack_83c;
                          uStack_838 = uStack_83c;
                          uStack_834 = uStack_83c;
                          uStack_830 = uStack_83c;
                          uStack_82c = uStack_83c;
                          uStack_828 = uStack_83c;
                          uStack_824 = uStack_83c;
                          uStack_81c = (local_c50.context)->instPrimID[0];
                          local_820 = uStack_81c;
                          uStack_818 = uStack_81c;
                          uStack_814 = uStack_81c;
                          uStack_810 = uStack_81c;
                          uStack_80c = uStack_81c;
                          uStack_808 = uStack_81c;
                          uStack_804 = uStack_81c;
                          local_c00 = local_be0._0_8_;
                          uStack_bf8 = local_be0._8_8_;
                          uStack_bf0 = local_be0._16_8_;
                          uStack_be8 = local_be0._24_8_;
                          local_c50.valid = (int *)&local_c00;
                          local_c50.geometryUserPtr = pGVar35->userPtr;
                          local_c50.ray = (RTCRayN *)ray;
                          local_c50.hit = local_920;
                          local_c50.N = 8;
                          if (pGVar35->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            local_e60 = fVar48;
                            auVar53 = ZEXT1632(auVar53._0_16_);
                            (*pGVar35->occlusionFilterN)(&local_c50);
                            auVar53 = vpcmpeqd_avx2(auVar53,auVar53);
                            pGVar35 = local_ca0;
                            uVar36 = local_e80;
                            uVar38 = local_e88;
                            uVar39 = local_e90;
                            uVar40 = local_e98;
                            uVar41 = local_ea0;
                            fVar48 = local_e60;
                          }
                          auVar25._8_8_ = uStack_bf8;
                          auVar25._0_8_ = local_c00;
                          auVar25._16_8_ = uStack_bf0;
                          auVar25._24_8_ = uStack_be8;
                          auVar71 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar25
                                                 );
                          auVar54 = auVar53 & ~auVar71;
                          if ((((((((auVar54 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (auVar54 >> 0x3f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar54 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && SUB321(auVar54 >> 0x7f,0) == '\0') &&
                                (auVar54 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                               && SUB321(auVar54 >> 0xbf,0) == '\0') &&
                              (auVar54 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                              -1 < auVar54[0x1f]) {
                            auVar71 = auVar71 ^ auVar53;
                          }
                          else {
                            p_Var7 = context->args->filter;
                            if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar35->field_8).field_0x2 & 0x40) != 0)))) {
                              local_e60 = fVar48;
                              auVar53 = ZEXT1632(auVar53._0_16_);
                              (*p_Var7)(&local_c50);
                              auVar53 = vpcmpeqd_avx2(auVar53,auVar53);
                              pGVar35 = local_ca0;
                              uVar36 = local_e80;
                              uVar38 = local_e88;
                              uVar39 = local_e90;
                              uVar40 = local_e98;
                              uVar41 = local_ea0;
                              fVar48 = local_e60;
                            }
                            auVar26._8_8_ = uStack_bf8;
                            auVar26._0_8_ = local_c00;
                            auVar26._16_8_ = uStack_bf0;
                            auVar26._24_8_ = uStack_be8;
                            auVar54 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                                                    auVar26);
                            auVar71 = auVar54 ^ auVar53;
                            auVar88._8_4_ = 0xff800000;
                            auVar88._0_8_ = 0xff800000ff800000;
                            auVar88._12_4_ = 0xff800000;
                            auVar88._16_4_ = 0xff800000;
                            auVar88._20_4_ = 0xff800000;
                            auVar88._24_4_ = 0xff800000;
                            auVar88._28_4_ = 0xff800000;
                            auVar53 = vblendvps_avx(auVar88,*(undefined1 (*) [32])
                                                             (local_c50.ray + 0x100),auVar54);
                            *(undefined1 (*) [32])(local_c50.ray + 0x100) = auVar53;
                          }
                          if ((((((((auVar71 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar71 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar71 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || SUB321(auVar71 >> 0x7f,0) != '\0') ||
                                (auVar71 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar71 >> 0xbf,0) != '\0') ||
                              (auVar71 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                              auVar71[0x1f] < '\0') {
                            if ((local_e20 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                            goto LAB_00619ad3;
                            break;
                          }
                          *(float *)(ray + k * 4 + 0x100) = fVar48;
                          lVar33 = 0;
                          uVar31 = local_dc0._0_8_ ^ 1L << (local_e00._0_8_ & 0x3f);
                          for (uVar29 = uVar31; (uVar29 & 1) == 0;
                              uVar29 = uVar29 >> 1 | 0x8000000000000000) {
                            lVar33 = lVar33 + 1;
                          }
                          local_e20[0] = uVar31 == 0;
                        } while (uVar31 != 0);
                      }
                    }
                  }
                }
              }
              local_cd0 = local_cd0 - 1 & local_cd0;
              sVar42 = k;
              pRVar45 = ray;
            } while (local_cd0 != 0);
          }
          auVar176 = ZEXT1664(local_d90);
          auVar138 = ZEXT1664(local_d10);
          auVar132 = ZEXT1664(local_d00);
          auVar111 = ZEXT1664(local_d80);
          auVar120 = ZEXT1664(local_e30);
          local_cc8 = local_cc8 + 1;
          bVar47 = local_cc8 < local_ce0;
          fVar48 = local_d70;
          fVar63 = fStack_d6c;
          fVar64 = fStack_d68;
          fVar66 = fStack_d64;
          fVar60 = local_d20;
          fVar67 = fStack_d1c;
          fVar75 = fStack_d18;
          fVar76 = fStack_d14;
          fVar61 = local_d30;
          fVar77 = fStack_d2c;
          fVar78 = fStack_d28;
          fVar79 = fStack_d24;
          fVar62 = local_d40;
          fVar163 = fStack_d3c;
          fVar164 = fStack_d38;
          fVar165 = fStack_d34;
          fVar65 = local_d50;
          fVar168 = fStack_d4c;
          fVar169 = fStack_d48;
          fVar170 = fStack_d44;
          fVar80 = local_d60;
          fVar133 = fStack_d5c;
          fVar139 = fStack_d58;
          fVar140 = fStack_d54;
        } while (local_cc8 != local_ce0);
      }
LAB_00619b36:
      uVar28 = 0;
      if (bVar47) {
        *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
        uVar28 = 1;
      }
    }
  } while ((uVar28 & 3) == 0);
  return local_ca8 != &local_800;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }